

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O0

event_process_result __thiscall
afsm::transitions::
state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>
::
transit_state_impl<afsm::state<afsm::test::connection_fsm_def::idle,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::terminated,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::test::events::terminate,afsm::actions::detail::guard_check<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def::idle,afsm::test::events::terminate,afsm::none>,afsm::actions::detail::action_invocation<afsm::test::transit_action,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def::idle,afsm::test::connection_fsm_def::terminated>,afsm::transitions::detail::state_exit<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::state<afsm::test::connection_fsm_def::idle,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::test::events::terminate>,afsm::transitions::detail::state_enter<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::state<afsm::test::connection_fsm_def::terminated,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::test::events::terminate>,afsm::transitions::detail::state_clear<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::state<afsm::test::connection_fsm_def::idle,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>
          (state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>
           *this,terminate *event,
          state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
          *source,state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                  *target,__int_type param_5)

{
  bool bVar1;
  state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  *psVar2;
  state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  *observer;
  basic_exception_safety *param_10_local;
  size_t target_index_local;
  state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
  *target_local;
  state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
  *source_local;
  terminate *event_local;
  state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>
  *this_local;
  state_enter_impl<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::state<afsm::test::connection_fsm_def::terminated,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,true>
  local_10;
  state_exit_impl<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::test::events::terminate,_true>
  local_f;
  action_invocation<afsm::test::transit_action,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def::idle,afsm::test::connection_fsm_def::terminated>
  local_e;
  guard_check<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def::idle,_afsm::test::events::terminate,_afsm::none>
  local_d;
  event_process_result local_c;
  
  bVar1 = actions::detail::
          guard_check<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def::idle,_afsm::test::events::terminate,_afsm::none>
          ::operator()(&local_d,*(state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                                  **)this,(idle *)source,event);
  if (bVar1) {
    psVar2 = root_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>
                       (*(state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                          **)this);
    detail::
    state_exit_impl<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::test::events::terminate,_true>
    ::operator()(&local_f,source,event,
                 *(state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                   **)this);
    afsm::detail::observer_wrapper<afsm::test::test_fsm_observer>::
    state_exited<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::state<afsm::test::connection_fsm_def::idle,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::test::events::terminate>
              (&psVar2->super_observer_wrapper<afsm::test::test_fsm_observer>,
               *(state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 **)this,source,event);
    actions::detail::
    action_invocation<afsm::test::transit_action,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def::idle,afsm::test::connection_fsm_def::terminated>
    ::operator()(&local_e,event,
                 *(state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                   **)this,(idle *)source,(terminated *)target);
    detail::
    state_enter_impl<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::state<afsm::test::connection_fsm_def::terminated,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,true>
    ::operator()(&local_10,target,event,
                 *(state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                   **)this);
    afsm::detail::observer_wrapper<afsm::test::test_fsm_observer>::
    state_entered<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::state<afsm::test::connection_fsm_def::terminated,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::test::events::terminate>
              (&psVar2->super_observer_wrapper<afsm::test::test_fsm_observer>,
               *(state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 **)this,target,event);
    bVar1 = detail::
            state_clear_impl<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_false>
            ::operator()((state_clear_impl<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_false>
                          *)((long)&this_local + 7),
                         *(state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                           **)this,source);
    if (bVar1) {
      afsm::detail::observer_wrapper<afsm::test::test_fsm_observer>::
      state_cleared<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::state<afsm::test::connection_fsm_def::idle,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>
                (&psVar2->super_observer_wrapper<afsm::test::test_fsm_observer>,
                 *(state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                   **)this,source);
    }
    std::__atomic_base<unsigned_long>::operator=((__atomic_base<unsigned_long> *)(this + 8),param_5)
    ;
    afsm::detail::observer_wrapper<afsm::test::test_fsm_observer>::
    state_changed<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::state<afsm::test::connection_fsm_def::idle,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::terminated,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::test::events::terminate>
              (&psVar2->super_observer_wrapper<afsm::test::test_fsm_observer>,
               *(state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 **)this,source,target,event);
    local_c = process;
  }
  else {
    local_c = refuse;
  }
  return local_c;
}

Assistant:

actions::event_process_result
    transit_state_impl(Event&& event, SourceState& source, TargetState& target,
            Guard guard, Action action, SourceExit exit,
            TargetEnter enter, SourceClear clear,
            ::std::size_t target_index,
            def::tags::basic_exception_safety const&)
    {
        if (guard(*fsm_, source, event)) {
            auto const& observer = root_machine(*fsm_);
            exit(source, ::std::forward<Event>(event), *fsm_);
            observer.state_exited(*fsm_, source, event);
            action(::std::forward<Event>(event), *fsm_, source, target);
            enter(target, ::std::forward<Event>(event), *fsm_);
            observer.state_entered(*fsm_, target, event);
            if (clear(*fsm_, source))
                observer.state_cleared(*fsm_, source);
            current_state_ = target_index;
            observer.state_changed(*fsm_, source, target, event);
            return actions::event_process_result::process;
        }
        return actions::event_process_result::refuse;
    }